

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_distefano_1999.h
# Opt level: O3

double __thiscall DiStefano::Alloc(DiStefano *this)

{
  ulong uVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  Mat1i *pMVar5;
  Mat1b *pMVar6;
  double dVar7;
  long lVar8;
  int *piVar9;
  bool *pbVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  Mat local_78 [96];
  
  lVar8 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar8;
  piVar9 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_78,*piVar9,piVar9[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_78);
  cv::Mat::~Mat(local_78);
  uVar2 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  lVar8 = (long)(((int)((ulong)uVar2 >> 0x20) + 1) / 2) * (long)(((int)uVar2 + 1) / 2);
  uVar1 = lVar8 + 1;
  uVar11 = -(ulong)(uVar1 >> 0x3e != 0) | lVar8 * 4 + 4U;
  piVar9 = (int *)operator_new__(uVar11);
  this->a_class = piVar9;
  pbVar10 = (bool *)operator_new__(uVar1);
  this->a_single = pbVar10;
  piVar9 = (int *)operator_new__(uVar11);
  this->a_renum = piVar9;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar5->field_0x10,0,*(long *)&pMVar5->field_0x20 - *(long *)&pMVar5->field_0x18
        );
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar3 = *(int *)&pMVar6->field_0x8;
  iVar4 = *(int *)&pMVar6->field_0xc;
  memset(this->a_class,0,
         (long)((iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1) *
         (long)((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1) * 4 + 4);
  uVar2 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  memset(this->a_single,0,
         (long)(((int)((ulong)uVar2 >> 0x20) + 1) / 2) * (long)(((int)uVar2 + 1) / 2) + 1);
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar3 = *(int *)&pMVar6->field_0x8;
  iVar4 = *(int *)&pMVar6->field_0xc;
  memset(this->a_renum,0,
         (long)((iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1) *
         (long)((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1) * 4 + 4);
  lVar8 = cv::getTickCount();
  dVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  dVar13 = (double)lVar8 -
           (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar13;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total +
       dVar13;
  lVar8 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar8;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar5->field_0x10,0,*(long *)&pMVar5->field_0x20 - *(long *)&pMVar5->field_0x18
        );
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar3 = *(int *)&pMVar6->field_0x8;
  iVar4 = *(int *)&pMVar6->field_0xc;
  memset(this->a_class,0,
         (long)((iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1) *
         (long)((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1) * 4 + 4);
  uVar2 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  memset(this->a_single,0,
         (long)(((int)((ulong)uVar2 >> 0x20) + 1) / 2) * (long)(((int)uVar2 + 1) / 2) + 1);
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar3 = *(int *)&pMVar6->field_0x8;
  iVar4 = *(int *)&pMVar6->field_0xc;
  memset(this->a_renum,0,
         (long)((iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1) *
         (long)((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1) * 4 + 4);
  lVar8 = cv::getTickCount();
  dVar14 = (double)lVar8 -
           (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar14;
  auVar12._0_8_ = dVar13 * 1000.0;
  auVar12._8_8_ = dVar14 * 1000.0;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       dVar14 + (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.
                total;
  auVar15._8_8_ =
       (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  auVar15._0_8_ = dVar7;
  auVar12 = divpd(auVar12,auVar15);
  return auVar12._0_8_ - auVar12._8_8_;
}

Assistant:

double Alloc()
    {
        // Memory allocation for the output image
        perf_.start();
        img_labels_ = cv::Mat1i(img_.size());
        a_class = new int[UPPER_BOUND_8_CONNECTIVITY];
        a_single = new bool[UPPER_BOUND_8_CONNECTIVITY];
        a_renum = new int[UPPER_BOUND_8_CONNECTIVITY];
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        memset(a_class, 0, UPPER_BOUND_8_CONNECTIVITY * sizeof(int));
        memset(a_single, 0, UPPER_BOUND_8_CONNECTIVITY * sizeof(bool));
        memset(a_renum, 0, UPPER_BOUND_8_CONNECTIVITY * sizeof(int));
        perf_.stop();
        double t = perf_.last();
        perf_.start();
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        memset(a_class, 0, UPPER_BOUND_8_CONNECTIVITY * sizeof(int));
        memset(a_single, 0, UPPER_BOUND_8_CONNECTIVITY * sizeof(bool));
        memset(a_renum, 0, UPPER_BOUND_8_CONNECTIVITY * sizeof(int));
        perf_.stop();
        double ma_t = t - perf_.last();
        // Return total time
        return ma_t;
    }